

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlnumber.c
# Opt level: O1

err_t RenderDataInt(ebml_integer *Element,stream *Output,bool_t bForceWithoutMandatory,
                   bool_t bWithDefault,int ForProfile,filepos_t *Rendered)

{
  int iVar1;
  int iVar2;
  err_t eVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint8_t FinalData [8];
  undefined8 local_38;
  undefined1 local_30 [8];
  
  if (((Element->Base).SizeLength < '\t') && (lVar6 = (Element->Base).DataSize, lVar6 != 0)) {
    uVar4 = Element->Value;
    iVar1 = (Element->Base).DefaultSize;
    lVar5 = (long)iVar1;
    local_38 = lVar6;
    if (lVar6 < lVar5) {
      iVar2 = ~(uint)lVar6 + iVar1;
      if (iVar2 != 0) {
        memset(local_30,0,(long)iVar2);
      }
      local_38 = (long)(int)(iVar1 - (uint)lVar6);
    }
    if (local_38 != 0) {
      do {
        local_30[local_38 + -1] = (char)uVar4;
        local_38 = local_38 + -1;
        uVar4 = uVar4 >> 8;
      } while (local_38 != 0);
      local_38 = 0;
    }
    if (lVar6 < lVar5) {
      lVar6 = lVar5;
      if (Output == (stream *)0x0) {
        __assert_fail("(const void*)(Output)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                      ,0x9b,
                      "err_t RenderDataInt(ebml_integer *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                     );
      }
    }
    else if (Output == (stream *)0x0) {
      __assert_fail("(const void*)(Output)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                    ,0x9d,
                    "err_t RenderDataInt(ebml_integer *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                   );
    }
    eVar3 = (**(code **)((long)(Output->Base).VMT + 0x70))(Output,local_30,lVar6,&local_38);
    if (Rendered != (filepos_t *)0x0) {
      *Rendered = local_38;
    }
  }
  else {
    eVar3 = 0;
  }
  return eVar3;
}

Assistant:

static err_t RenderDataInt(ebml_integer *Element, struct stream *Output, bool_t UNUSED_PARAM(bForceWithoutMandatory), bool_t UNUSED_PARAM(bWithDefault), int UNUSED_PARAM(ForProfile), filepos_t *Rendered)
{
    uint8_t FinalData[8]; // we don't handle more than 64 bits integers
    size_t i;
    uint64_t TempValue = Element->Value;
    err_t Err;

    if (Element->Base.SizeLength > EBML_MAX_SIZE)
        return 0; // integers larger than 64 bits are not supported

    if (Element->Base.DataSize == 0)
        return 0; // nothing to write

    TempValue = Element->Value;
    if (Element->Base.DefaultSize > Element->Base.DataSize)
    {
        for (i=Element->Base.DefaultSize - (int)Element->Base.DataSize - 1;i;--i)
            FinalData[i-1] = 0;
        i = Element->Base.DefaultSize - (int)Element->Base.DataSize;
    }
    else
        i=(size_t)Element->Base.DataSize;
    for (;i;--i) {
        FinalData[i-1] = (uint8_t)(TempValue & 0xFF);
        TempValue >>= 8;
    }

    if (Element->Base.DefaultSize > Element->Base.DataSize)
        Err = Stream_Write(Output,FinalData,(size_t)Element->Base.DefaultSize,&i);
    else
        Err = Stream_Write(Output,FinalData,(size_t)Element->Base.DataSize,&i);
    if (Rendered)
        *Rendered = i;
    return Err;
}